

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_plague(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  long in_RCX;
  long in_RDX;
  __type_conflict2 _Var2;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff58;
  CHAR_DATA *in_stack_ffffffffffffff60;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff94;
  CHAR_DATA *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  
  ch_00 = *(CHAR_DATA **)(in_RCX + 0x1b0);
  _Var2 = std::pow<int,int>(0,0x619180);
  if (((ulong)ch_00 & (long)_Var2) != 0) {
    return;
  }
  bVar1 = saves_spell(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94)
  ;
  if (!bVar1) {
    bVar1 = is_npc(in_stack_ffffffffffffff58);
    if (bVar1) {
      in_stack_ffffffffffffff60 = *(CHAR_DATA **)(in_RCX + 0x180);
      _Var2 = std::pow<int,int>(0,0x6191eb);
      if (((ulong)in_stack_ffffffffffffff60 & (long)_Var2) != 0) goto LAB_00619219;
    }
    bVar1 = is_affected_by(ch_00,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    if (!bVar1) {
      init_affect((AFFECT_DATA *)0x6192ed);
      std::pow<int,int>(0,0x619351);
      new_affect_join(in_stack_ffffffffffffff60,(AFFECT_DATA *)in_stack_ffffffffffffff58);
      send_to_char(in_stack_ffffffffffffff70,ch_00);
      act(in_stack_ffffffffffffff70,ch_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
      return;
    }
  }
LAB_00619219:
  if (in_RDX == in_RCX) {
    act(in_stack_ffffffffffffff70,ch_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
    act(in_stack_ffffffffffffff70,ch_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
  }
  else {
    act(in_stack_ffffffffffffff70,ch_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
    act(in_stack_ffffffffffffff70,ch_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
    act(in_stack_ffffffffffffff70,ch_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
  }
  return;
}

Assistant:

void spell_plague(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (IS_SET(victim->imm_flags, IMM_DISEASE))
		return;

	if (saves_spell(level, victim, DAM_DISEASE)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_UNDEAD))
		|| is_affected_by(victim, AFF_PLAGUE))
	{
		if (ch == victim)
		{
			act("A sudden fever washes over you, but it passes.", ch, 0, 0, TO_CHAR);
			act("$n looks flushed for a moment, but it passes.", ch, 0, 0, TO_ROOM);
		}
		else
		{
			act("$N resists the disease.", ch, nullptr, victim, TO_CHAR);
			act("A sudden fever washes over you, but it passes.", ch, 0, victim, TO_VICT);
			act("$N looks flushed for a moment, but it passes.", ch, 0, victim, TO_NOTVICT);
		}

		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_MALADY;
	af.type = gsn_plague;
	af.level = level * 3 / 4;
	af.duration = level / 3;
	af.location = APPLY_STR;
	af.modifier = -5;

	SET_BIT(af.bitvector, AFF_PLAGUE);

	af.owner = ch;
	af.tick_fun = plague_tick;
	af.end_fun = nullptr;
	new_affect_join(victim, &af);

	send_to_char("You scream in agony as plague sores erupt from your skin.\n\r", victim);
	act("$n screams in agony as plague sores erupt from $s skin.", victim, nullptr, nullptr, TO_ROOM);
}